

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

interval_t
duckdb::DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
          (interval_t left,double right)

{
  bool bVar1;
  OutOfRangeException *this;
  interval_t *in_RCX;
  interval_t left_00;
  allocator local_49;
  interval_t result;
  string local_38;
  
  left_00._0_8_ = left.micros;
  left_00.micros = (int64_t)&result;
  bVar1 = TryMultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                    (left._0_8_,left_00,1.0 / right,in_RCX);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Overflow in INTERVAL division",&local_49);
  OutOfRangeException::OutOfRangeException(this,&local_38);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

interval_t DivideOperator::Operation(interval_t left, double right) {
	interval_t result;
	if (!TryMultiplyOperator::Operation<interval_t, double, interval_t>(left, 1.0 / right, result)) {
		throw OutOfRangeException("Overflow in INTERVAL division");
	}

	return result;
}